

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra.h
# Opt level: O0

int Extra_TruthIsEqual(uint *pIn0,uint *pIn1,int nVars)

{
  int local_28;
  int w;
  int nVars_local;
  uint *pIn1_local;
  uint *pIn0_local;
  
  local_28 = Extra_TruthWordNum(nVars);
  do {
    local_28 = local_28 + -1;
    if (local_28 < 0) {
      return 1;
    }
  } while (pIn0[local_28] == pIn1[local_28]);
  return 0;
}

Assistant:

static inline int Extra_TruthIsEqual( unsigned * pIn0, unsigned * pIn1, int nVars )
{
    int w;
    for ( w = Extra_TruthWordNum(nVars)-1; w >= 0; w-- )
        if ( pIn0[w] != pIn1[w] )
            return 0;
    return 1;
}